

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

InlinedStringField * __thiscall
google::protobuf::Reflection::MutableField<google::protobuf::internal::InlinedStringField>
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  InlinedStringField *pIVar2;
  OneofDescriptor *pOVar3;
  
  bVar1 = internal::ReflectionSchema::InRealOneof(&this->schema_,field);
  if (bVar1) {
    if ((field->field_0x1 & 0x10) == 0) {
      pOVar3 = (OneofDescriptor *)0x0;
    }
    else {
      pOVar3 = (field->scope_).containing_oneof;
      if (pOVar3 == (OneofDescriptor *)0x0) goto LAB_002691ca;
    }
    if ((pOVar3->field_count_ == 1) && ((pOVar3->fields_->field_0x1 & 2) != 0)) {
      MutableField<google::protobuf::internal::InlinedStringField>();
LAB_002691ca:
      internal::protobuf_assumption_failed
                ("res != nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb31);
    }
    *(int *)((long)&(message->super_MessageLite)._vptr_MessageLite +
            (ulong)(uint)((int)((ulong)((long)pOVar3 - (long)pOVar3->containing_type_->oneof_decls_)
                               >> 3) * -0x24924924 + (this->schema_).oneof_case_offset_)) =
         field->number_;
  }
  else {
    SetHasBit(this,message,field);
  }
  VerifyFieldType<google::protobuf::internal::InlinedStringField>(this,field);
  pIVar2 = (InlinedStringField *)MutableRawImpl(this,message,field);
  return pIVar2;
}

Assistant:

Type* Reflection::MutableField(Message* message,
                               const FieldDescriptor* field) const {
  schema_.InRealOneof(field) ? SetOneofCase(message, field)
                             : SetHasBit(message, field);
  return MutableRaw<Type>(message, field);
}